

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::
rebalance_after_delete
          (btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
           *this,iterator iter)

{
  uint uVar1;
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_> *pbVar2
  ;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_> *pbVar6
  ;
  iterator iVar7;
  bool merged;
  undefined1 auStack_40 [7];
  bool first_iteration;
  iterator res;
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *this_local;
  iterator iter_local;
  int local_10;
  
  iter_local.node._0_4_ = iter.position;
  res.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              *)CONCAT44(iter_local.node._4_4_,(uint)iter_local.node);
  bVar3 = true;
  _auStack_40 = (btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 *)iter.node;
  res._8_8_ = this;
  for (this_local = _auStack_40; pbVar2 = this_local,
      pbVar6 = (btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                *)root(this), pbVar2 != pbVar6;
      this_local = (btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                    *)btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                      ::parent((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                                *)this_local)) {
    bVar5 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            ::count((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                     *)this_local);
    if (0xe < bVar5) goto LAB_002fc3ff;
    bVar4 = try_merge_or_rebalance(this,(iterator *)&this_local);
    if (bVar3) {
      _auStack_40 = this_local;
      res.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                  *)CONCAT44(res.node._4_4_,(uint)iter_local.node);
      bVar3 = false;
    }
    if (!bVar4) goto LAB_002fc3ff;
    bVar5 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            ::position((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                        *)this_local);
    iter_local.node._0_4_ = (uint)bVar5;
  }
  try_shrink(this);
  bVar3 = empty(this);
  if (bVar3) {
    iVar7 = end(this);
    iter_local._8_8_ = iVar7.node;
    local_10 = iVar7.position;
  }
  else {
LAB_002fc3ff:
    uVar1 = (uint)res.node;
    bVar5 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            ::count((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                     *)_auStack_40);
    if (uVar1 == bVar5) {
      bVar5 = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                       *)_auStack_40);
      res.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                  *)CONCAT44(res.node._4_4_,bVar5 - 1);
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
                    *)auStack_40);
    }
    iter_local._8_8_ = _auStack_40;
    local_10 = (int)res.node;
  }
  iVar7.position = local_10;
  iVar7.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                *)iter_local._8_8_;
  iVar7._12_4_ = 0;
  return iVar7;
}

Assistant:

auto btree<P>::rebalance_after_delete(iterator iter) -> iterator {
        // Merge/rebalance as we walk back up the tree.
        iterator res(iter);
        bool first_iteration = true;
        for (;;) {
            if (iter.node == root()) {
                try_shrink();
                if (empty()) {
                    return end();
                }
                break;
            }
            if (iter.node->count() >= kMinNodeValues) {
                break;
            }
            bool merged = try_merge_or_rebalance(&iter);
            // On the first iteration, we should update `res` with `iter` because `res`
            // may have been invalidated.
            if (first_iteration) {
                res = iter;
                first_iteration = false;
            }
            if (!merged) {
                break;
            }
            iter.position = iter.node->position();
            iter.node = iter.node->parent();
        }

        // Adjust our return value. If we're pointing at the end of a node, advance
        // the iterator.
        if (res.position == res.node->count()) {
            res.position = res.node->count() - 1;
            ++res;
        }

        return res;
    }